

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

QDnsMailExchangeRecord __thiscall
QList<QDnsMailExchangeRecord>::takeAt(QList<QDnsMailExchangeRecord> *this,qsizetype i)

{
  pointer pQVar1;
  long in_RDX;
  
  (this->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = data((QList<QDnsMailExchangeRecord> *)i);
  QDnsMailExchangeRecord::QDnsMailExchangeRecord((QDnsMailExchangeRecord *)this,pQVar1 + in_RDX);
  if ((*(int **)i == (int *)0x0) || (1 < **(int **)i)) {
    QArrayDataPointer<QDnsMailExchangeRecord>::reallocateAndGrow
              ((QArrayDataPointer<QDnsMailExchangeRecord> *)i,GrowsAtEnd,0,
               (QArrayDataPointer<QDnsMailExchangeRecord> *)0x0);
  }
  QtPrivate::QMovableArrayOps<QDnsMailExchangeRecord>::erase
            ((QMovableArrayOps<QDnsMailExchangeRecord> *)i,
             (QDnsMailExchangeRecord *)(in_RDX * 8 + *(long *)(i + 8)),1);
  return (QSharedDataPointer<QDnsMailExchangeRecordPrivate>)
         (QSharedDataPointer<QDnsMailExchangeRecordPrivate>)this;
}

Assistant:

T takeAt(qsizetype i) { T t = std::move((*this)[i]); remove(i); return t; }